

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O3

void __thiscall CLayer::~CLayer(CLayer *this)

{
  CGrid *pCVar1;
  CGrid *pCVar2;
  CDesign *pCVar3;
  long lVar4;
  long lVar5;
  
  (this->super_CObject)._vptr_CObject = (_func_int **)&PTR__CLayer_0018aba0;
  if ((CObject::m_pDesign->super_CBBox).m_iMinX < (CObject::m_pDesign->super_CBBox).m_iMaxX) {
    lVar4 = 0;
    pCVar3 = CObject::m_pDesign;
    do {
      pCVar1 = this->m_ppGrid[lVar4];
      if (pCVar1 != (CGrid *)0x0) {
        pCVar2 = pCVar1[-1].m_pAdjGrid[3];
        if (pCVar2 != (CGrid *)0x0) {
          lVar5 = (long)pCVar2 * 0x98;
          do {
            CGrid::~CGrid((CGrid *)((long)pCVar1[-1].m_pAdjGrid + lVar5 + -0x78));
            lVar5 = lVar5 + -0x98;
          } while (lVar5 != 0);
        }
        operator_delete__(pCVar1[-1].m_pAdjGrid + 3,(long)pCVar2 * 0x98 + 8);
        this->m_ppGrid[lVar4] = (CGrid *)0x0;
        pCVar3 = CObject::m_pDesign;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)(pCVar3->super_CBBox).m_iMaxX - (long)(pCVar3->super_CBBox).m_iMinX);
  }
  if (this->m_ppGrid != (CGrid **)0x0) {
    operator_delete__(this->m_ppGrid);
    this->m_ppGrid = (CGrid **)0x0;
  }
  if (this->m_pMaze != (uchar *)0x0) {
    operator_delete__(this->m_pMaze);
    this->m_pMaze = (uchar *)0x0;
  }
  __gnu_cxx::
  hashtable<std::pair<const_long_long,_std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>_>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>_>_>,_std::equal_to<long_long>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>_>_>
  ::~hashtable(&(this->m_CBoundaryBucketItr)._M_ht);
  std::
  _Rb_tree<int,_std::pair<const_int,_CBoundary_*>,_std::_Select1st<std::pair<const_int,_CBoundary_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>
  ::~_Rb_tree(&(this->m_CBoundaryBucket)._M_t);
  CObject::~CObject(&this->super_CObject);
  return;
}

Assistant:

CLayer::~CLayer()
{
	for (int i=0;i<GetDesign()->W();++i)	SAFE_DELA(m_ppGrid[i]);
	SAFE_DELA(m_ppGrid);

	//for (int i=0;i<m_iMaxBX;++i)	SAFE_DELA(m_ppBoundary[i]);

	//SAFE_DELA(m_ppBoundary);
	SAFE_DELA(m_pMaze);
}